

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_set.h
# Opt level: O2

void __thiscall
embree::parallel_set<unsigned_int>::init<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (parallel_set<unsigned_int> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *in)

{
  pointer puVar1;
  pointer puVar2;
  uint *src;
  char cVar3;
  runtime_error *this_00;
  anon_class_8_1_898bcfc2 local_d8;
  blocked_range<unsigned_long> local_d0;
  anon_class_16_2_e88080a0 local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->vec,
             (long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  puVar1 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8.this = this;
  local_b8.in = in;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)&temp,(context_traits)0x4,CUSTOM_CTX);
  local_d0.my_begin = 0;
  local_d0.my_grainsize = 0x4000;
  local_d8.func = &local_b8;
  local_d0.my_end = (long)puVar1 - (long)puVar2 >> 2;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::parallel_set<unsigned_int>::init<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::parallel_set<unsigned_int>::init<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            (&local_d0,&local_d8,(task_group_context *)&temp);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&temp);
  if (cVar3 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&temp);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&temp,(long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_d0
              );
    src = (this->vec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start;
    radix_sort<unsigned_int>
              (src,temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
               (long)(this->vec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)src >> 2,0x2000);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(const Vector& in) 
    {
      /* copy data to internal vector */
      vec.resize(in.size());
      parallel_for( size_t(0), in.size(), size_t(4*4096), [&](const range<size_t>& r) {
	for (size_t i=r.begin(); i<r.end(); i++) 
	  vec[i] = in[i];
      });

      /* sort the data */
      std::vector<T> temp(in.size());
      radix_sort<T>(vec.data(),temp.data(),vec.size());
    }